

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_ar.c
# Opt level: O3

int archive_read_format_ar_read_header(archive_read *a,archive_entry *entry)

{
  char cVar1;
  ar *ar;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  uint64_t uVar5;
  void *__src;
  char *pcVar6;
  char *pcVar7;
  long s;
  char local_48 [4];
  undefined4 uStack_44;
  char local_40;
  char local_39 [9];
  
  pcVar6 = local_48;
  ar = (ar *)a->format->data;
  if (ar->read_global_header == '\0') {
    __archive_read_consume(a,8);
    ar->read_global_header = '\x01';
    (a->archive).archive_format = 0x70000;
  }
  pcVar3 = (char *)__archive_read_ahead(a,0x3c,(ssize_t *)0x0);
  if (pcVar3 == (char *)0x0) {
    return 1;
  }
  if ((pcVar3[0x3a] != '`') || (pcVar3[0x3b] != '\n')) {
    pcVar6 = "Incorrect file header signature";
    goto LAB_0044f47c;
  }
  strncpy(local_48,pcVar3,0x10);
  local_39[1] = 0;
  iVar2 = (a->archive).archive_format;
  if (iVar2 == 0x70002) {
LAB_0044f4e1:
    pcVar7 = "ar (BSD)";
  }
  else {
    pcVar7 = "ar (GNU/SVR4)";
    if (iVar2 != 0x70001) {
      if (iVar2 == 0x70000) {
        if (local_48[2] != '/' || CONCAT11(local_48[1],local_48[0]) != 0x3123) {
          pcVar4 = strchr(local_48,0x2f);
          if (pcVar4 != (char *)0x0) {
            (a->archive).archive_format = 0x70001;
            goto LAB_0044f4e8;
          }
          if (local_40 != 'F' ||
              CONCAT44(uStack_44,
                       CONCAT13(local_48[3],CONCAT12(local_48[2],CONCAT11(local_48[1],local_48[0])))
                      ) != 0x45444d59532e5f5f) goto LAB_0044f4d1;
        }
        (a->archive).archive_format = 0x70002;
        goto LAB_0044f4e1;
      }
LAB_0044f4d1:
      pcVar7 = "ar";
    }
  }
LAB_0044f4e8:
  (a->archive).archive_format_name = pcVar7;
  pcVar7 = local_39;
  do {
    cVar1 = *pcVar7;
    if (cVar1 != ' ') break;
    *pcVar7 = '\0';
    pcVar7 = pcVar7 + -1;
  } while (local_48 <= pcVar7);
  if (((local_48 < pcVar7) && (local_48[0] != '/')) && (*pcVar7 == '/')) {
    *pcVar7 = '\0';
  }
  if (cVar1 == ' ') {
    pcVar6 = "Found entry with empty filename";
LAB_0044f522:
    iVar2 = -1;
LAB_0044f484:
    archive_set_error(&a->archive,iVar2,pcVar6);
  }
  else {
    if (local_48[2] == '\0' && CONCAT11(local_48[1],local_48[0]) == 0x2f2f) {
      ar_parse_common_header(ar,entry,pcVar3);
      archive_entry_copy_pathname(entry,local_48);
      archive_entry_set_filetype(entry,0x8000);
      uVar5 = ar_atol10(pcVar3 + 0x30,10);
      if (0x40000000 < uVar5) {
        pcVar6 = "Filename table too large";
        goto LAB_0044f522;
      }
      if (uVar5 == 0) {
        pcVar6 = "Invalid string table";
      }
      else {
        if (ar->strtab == (char *)0x0) {
          pcVar6 = (char *)malloc(uVar5);
          if (pcVar6 != (char *)0x0) {
            ar->strtab = pcVar6;
            ar->strtab_size = uVar5;
            __archive_read_consume(a,0x3c);
            __src = __archive_read_ahead(a,uVar5,(ssize_t *)0x0);
            if (__src == (void *)0x0) {
              return -0x1e;
            }
            memcpy(pcVar6,__src,uVar5);
            __archive_read_consume(a,uVar5);
            ar->entry_bytes_remaining = 0;
            archive_entry_set_size(entry,0);
            iVar2 = ar_parse_gnu_filename_table(a);
            return iVar2;
          }
          pcVar6 = "Can\'t allocate filename table buffer";
          iVar2 = 0xc;
          goto LAB_0044f484;
        }
        pcVar6 = "More than one string tables exist";
      }
LAB_0044f47c:
      iVar2 = 0x16;
      goto LAB_0044f484;
    }
    if ((local_48[0] != '/') || (9 < (byte)(local_48[1] - 0x30U))) {
      if (local_48[2] == '/' && CONCAT11(local_48[1],local_48[0]) == 0x3123) {
        ar_parse_common_header(ar,entry,pcVar3);
        uVar5 = ar_atol10(pcVar3 + 3,0xd);
        if ((uVar5 < 0x100001) &&
           (s = ar->entry_bytes_remaining - uVar5, (long)uVar5 <= ar->entry_bytes_remaining)) {
          ar->entry_bytes_remaining = s;
          archive_entry_set_size(entry,s);
          __archive_read_consume(a,0x3c);
          pcVar6 = (char *)__archive_read_ahead(a,uVar5,(ssize_t *)0x0);
          if (pcVar6 == (char *)0x0) {
            pcVar6 = "Truncated input file";
            iVar2 = -1;
          }
          else {
            pcVar3 = (char *)malloc(uVar5 + 1);
            if (pcVar3 != (char *)0x0) {
              strncpy(pcVar3,pcVar6,uVar5);
              pcVar3[uVar5] = '\0';
              __archive_read_consume(a,uVar5);
              archive_entry_copy_pathname(entry,pcVar3);
              free(pcVar3);
              return 0;
            }
            pcVar6 = "Can\'t allocate fname buffer";
            iVar2 = 0xc;
          }
          archive_set_error(&a->archive,iVar2,pcVar6);
          return -0x1e;
        }
        pcVar6 = "Bad input file size";
        goto LAB_0044f522;
      }
      if (CONCAT11(local_48[1],local_48[0]) != 0x2f) goto LAB_0044f6ba;
      archive_entry_copy_pathname(entry,"/");
      ar_parse_common_header(ar,entry,pcVar3);
      archive_entry_set_filetype(entry,0x8000);
LAB_0044f6d0:
      iVar2 = 0;
      goto LAB_0044f490;
    }
    uVar5 = ar_atol10(pcVar3 + 1,0xf);
    if ((ar->strtab != (char *)0x0) && (uVar5 < ar->strtab_size)) {
      pcVar6 = ar->strtab + uVar5;
LAB_0044f6ba:
      archive_entry_copy_pathname(entry,pcVar6);
      ar_parse_common_header(ar,entry,pcVar3);
      goto LAB_0044f6d0;
    }
    archive_set_error(&a->archive,0x16,"Can\'t find long filename for GNU/SVR4 archive entry");
    archive_entry_copy_pathname(entry,local_48);
    ar_parse_common_header(ar,entry,pcVar3);
  }
  iVar2 = -0x1e;
LAB_0044f490:
  __archive_read_consume(a,0x3c);
  return iVar2;
}

Assistant:

static int
_ar_read_header(struct archive_read *a, struct archive_entry *entry,
	struct ar *ar, const char *h, size_t *unconsumed)
{
	char filename[AR_name_size + 1];
	uint64_t number; /* Used to hold parsed numbers before validation. */
	size_t bsd_name_length, entry_size;
	char *p, *st;
	const void *b;
	int r;

	/* Verify the magic signature on the file header. */
	if (strncmp(h + AR_fmag_offset, "`\n", 2) != 0) {
		archive_set_error(&a->archive, EINVAL,
		    "Incorrect file header signature");
		return (ARCHIVE_FATAL);
	}

	/* Copy filename into work buffer. */
	strncpy(filename, h + AR_name_offset, AR_name_size);
	filename[AR_name_size] = '\0';

	/*
	 * Guess the format variant based on the filename.
	 */
	if (a->archive.archive_format == ARCHIVE_FORMAT_AR) {
		/* We don't already know the variant, so let's guess. */
		/*
		 * Biggest clue is presence of '/': GNU starts special
		 * filenames with '/', appends '/' as terminator to
		 * non-special names, so anything with '/' should be
		 * GNU except for BSD long filenames.
		 */
		if (strncmp(filename, "#1/", 3) == 0)
			a->archive.archive_format = ARCHIVE_FORMAT_AR_BSD;
		else if (strchr(filename, '/') != NULL)
			a->archive.archive_format = ARCHIVE_FORMAT_AR_GNU;
		else if (strncmp(filename, "__.SYMDEF", 9) == 0)
			a->archive.archive_format = ARCHIVE_FORMAT_AR_BSD;
		/*
		 * XXX Do GNU/SVR4 'ar' programs ever omit trailing '/'
		 * if name exactly fills 16-byte field?  If so, we
		 * can't assume entries without '/' are BSD. XXX
		 */
	}

	/* Update format name from the code. */
	if (a->archive.archive_format == ARCHIVE_FORMAT_AR_GNU)
		a->archive.archive_format_name = "ar (GNU/SVR4)";
	else if (a->archive.archive_format == ARCHIVE_FORMAT_AR_BSD)
		a->archive.archive_format_name = "ar (BSD)";
	else
		a->archive.archive_format_name = "ar";

	/*
	 * Remove trailing spaces from the filename.  GNU and BSD
	 * variants both pad filename area out with spaces.
	 * This will only be wrong if GNU/SVR4 'ar' implementations
	 * omit trailing '/' for 16-char filenames and we have
	 * a 16-char filename that ends in ' '.
	 */
	p = filename + AR_name_size - 1;
	while (p >= filename && *p == ' ') {
		*p = '\0';
		p--;
	}

	/*
	 * Remove trailing slash unless first character is '/'.
	 * (BSD entries never end in '/', so this will only trim
	 * GNU-format entries.  GNU special entries start with '/'
	 * and are not terminated in '/', so we don't trim anything
	 * that starts with '/'.)
	 */
	if (filename[0] != '/' && p > filename && *p == '/') {
		*p = '\0';
	}

	if (p < filename) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Found entry with empty filename");
		return (ARCHIVE_FATAL);
	}

	/*
	 * '//' is the GNU filename table.
	 * Later entries can refer to names in this table.
	 */
	if (strcmp(filename, "//") == 0) {
		/* This must come before any call to _read_ahead. */
		ar_parse_common_header(ar, entry, h);
		archive_entry_copy_pathname(entry, filename);
		archive_entry_set_filetype(entry, AE_IFREG);
		/* Get the size of the filename table. */
		number = ar_atol10(h + AR_size_offset, AR_size_size);
		if (number > SIZE_MAX || number > 1024 * 1024 * 1024) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Filename table too large");
			return (ARCHIVE_FATAL);
		}
		entry_size = (size_t)number;
		if (entry_size == 0) {
			archive_set_error(&a->archive, EINVAL,
			    "Invalid string table");
			return (ARCHIVE_FATAL);
		}
		if (ar->strtab != NULL) {
			archive_set_error(&a->archive, EINVAL,
			    "More than one string tables exist");
			return (ARCHIVE_FATAL);
		}

		/* Read the filename table into memory. */
		st = malloc(entry_size);
		if (st == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate filename table buffer");
			return (ARCHIVE_FATAL);
		}
		ar->strtab = st;
		ar->strtab_size = entry_size;

		if (*unconsumed) {
			__archive_read_consume(a, *unconsumed);
			*unconsumed = 0;
		}

		if ((b = __archive_read_ahead(a, entry_size, NULL)) == NULL)
			return (ARCHIVE_FATAL);
		memcpy(st, b, entry_size);
		__archive_read_consume(a, entry_size);
		/* All contents are consumed. */
		ar->entry_bytes_remaining = 0;
		archive_entry_set_size(entry, ar->entry_bytes_remaining);

		/* Parse the filename table. */
		return (ar_parse_gnu_filename_table(a));
	}

	/*
	 * GNU variant handles long filenames by storing /<number>
	 * to indicate a name stored in the filename table.
	 * XXX TODO: Verify that it's all digits... Don't be fooled
	 * by "/9xyz" XXX
	 */
	if (filename[0] == '/' && filename[1] >= '0' && filename[1] <= '9') {
		number = ar_atol10(h + AR_name_offset + 1, AR_name_size - 1);
		/*
		 * If we can't look up the real name, warn and return
		 * the entry with the wrong name.
		 */
		if (ar->strtab == NULL || number >= ar->strtab_size) {
			archive_set_error(&a->archive, EINVAL,
			    "Can't find long filename for GNU/SVR4 archive entry");
			archive_entry_copy_pathname(entry, filename);
			/* Parse the time, owner, mode, size fields. */
			ar_parse_common_header(ar, entry, h);
			return (ARCHIVE_FATAL);
		}

		archive_entry_copy_pathname(entry, &ar->strtab[(size_t)number]);
		/* Parse the time, owner, mode, size fields. */
		return (ar_parse_common_header(ar, entry, h));
	}

	/*
	 * BSD handles long filenames by storing "#1/" followed by the
	 * length of filename as a decimal number, then prepends the
	 * the filename to the file contents.
	 */
	if (strncmp(filename, "#1/", 3) == 0) {
		/* Parse the time, owner, mode, size fields. */
		/* This must occur before _read_ahead is called again. */
		ar_parse_common_header(ar, entry, h);

		/* Parse the size of the name, adjust the file size. */
		number = ar_atol10(h + AR_name_offset + 3, AR_name_size - 3);
		/* Sanity check the filename length:
		 *   = Must be <= SIZE_MAX - 1
		 *   = Must be <= 1MB
		 *   = Cannot be bigger than the entire entry
		 */
		if (number > SIZE_MAX - 1
		    || number > 1024 * 1024
		    || (int64_t)number > ar->entry_bytes_remaining) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Bad input file size");
			return (ARCHIVE_FATAL);
		}
		bsd_name_length = (size_t)number;
		ar->entry_bytes_remaining -= bsd_name_length;
		/* Adjust file size reported to client. */
		archive_entry_set_size(entry, ar->entry_bytes_remaining);

		if (*unconsumed) {
			__archive_read_consume(a, *unconsumed);
			*unconsumed = 0;
		}

		/* Read the long name into memory. */
		if ((b = __archive_read_ahead(a, bsd_name_length, NULL)) == NULL) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Truncated input file");
			return (ARCHIVE_FATAL);
		}
		/* Store it in the entry. */
		p = (char *)malloc(bsd_name_length + 1);
		if (p == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate fname buffer");
			return (ARCHIVE_FATAL);
		}
		strncpy(p, b, bsd_name_length);
		p[bsd_name_length] = '\0';

		__archive_read_consume(a, bsd_name_length);

		archive_entry_copy_pathname(entry, p);
		free(p);
		return (ARCHIVE_OK);
	}

	/*
	 * "/" is the SVR4/GNU archive symbol table.
	 */
	if (strcmp(filename, "/") == 0) {
		archive_entry_copy_pathname(entry, "/");
		/* Parse the time, owner, mode, size fields. */
		r = ar_parse_common_header(ar, entry, h);
		/* Force the file type to a regular file. */
		archive_entry_set_filetype(entry, AE_IFREG);
		return (r);
	}

	/*
	 * "__.SYMDEF" is a BSD archive symbol table.
	 */
	if (strcmp(filename, "__.SYMDEF") == 0) {
		archive_entry_copy_pathname(entry, filename);
		/* Parse the time, owner, mode, size fields. */
		return (ar_parse_common_header(ar, entry, h));
	}

	/*
	 * Otherwise, this is a standard entry.  The filename
	 * has already been trimmed as much as possible, based
	 * on our current knowledge of the format.
	 */
	archive_entry_copy_pathname(entry, filename);
	return (ar_parse_common_header(ar, entry, h));
}